

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

void Term_queue_chars(wchar_t x,wchar_t y,wchar_t n,wchar_t a,wchar_t *s)

{
  term_win *ptVar1;
  int *piVar2;
  wchar_t *pwVar3;
  int *piVar4;
  wchar_t *pwVar5;
  term *ptVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  ptVar6 = Term;
  ptVar1 = Term->scr;
  piVar2 = ptVar1->a[y];
  pwVar3 = ptVar1->c[y];
  piVar4 = ptVar1->ta[y];
  pwVar5 = ptVar1->tc[y];
  iVar8 = -1;
  iVar7 = -1;
  for (lVar9 = 0; n != (wchar_t)lVar9; lVar9 = lVar9 + 1) {
    if ((((piVar2[x + lVar9] != a) || (pwVar3[x + lVar9] != s[lVar9])) || (piVar4[x + lVar9] != 0))
       || (pwVar5[x + lVar9] != L'\0')) {
      piVar2[x + lVar9] = a;
      pwVar3[x + lVar9] = s[lVar9];
      piVar4[x + lVar9] = 0;
      pwVar5[x + lVar9] = L'\0';
      iVar8 = x + (wchar_t)lVar9;
      if (iVar7 < 0) {
        iVar7 = iVar8;
      }
    }
  }
  if (-1 < iVar7) {
    if (y < ptVar6->y1) {
      ptVar6->y1 = y;
    }
    if (ptVar6->y2 < y) {
      ptVar6->y2 = y;
    }
    if (iVar7 < ptVar6->x1[y]) {
      ptVar6->x1[y] = iVar7;
    }
    if (ptVar6->x2[y] < iVar8) {
      ptVar6->x2[y] = iVar8;
    }
  }
  return;
}

Assistant:

void Term_queue_chars(int x, int y, int n, int a, const wchar_t *s)
{
	int x1 = -1, x2 = -1;

	int *scr_aa = Term->scr->a[y];
	wchar_t *scr_cc = Term->scr->c[y];

	int *scr_taa = Term->scr->ta[y];
	wchar_t *scr_tcc = Term->scr->tc[y];

	/* Queue the attr/chars */
	for ( ; n; x++, s++, n--) {
		int oa = scr_aa[x];
		wchar_t oc = scr_cc[x];

		int ota = scr_taa[x];
		wchar_t otc = scr_tcc[x];

		/* Hack -- Ignore non-changes */
		if ((oa == a) && (oc == *s) && (ota == 0) && (otc == 0)) continue;

		/* Save the "literal" information */
		scr_aa[x] = a;
		scr_cc[x] = *s;

		scr_taa[x] = 0;
		scr_tcc[x] = 0;

		/* Note the "range" of window updates */
		if (x1 < 0) x1 = x;
		x2 = x;
	}

	/* Expand the "change area" as needed */
	if (x1 >= 0) {
		/* Check for new min/max row info */
		if (y < Term->y1) Term->y1 = y;
		if (y > Term->y2) Term->y2 = y;

		/* Check for new min/max col info in this row */
		if (x1 < Term->x1[y]) Term->x1[y] = x1;
		if (x2 > Term->x2[y]) Term->x2[y] = x2;
	}
}